

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_CordIo_Test::~IoTest_CordIo_Test
          (IoTest_CordIo_Test *this)

{
  IoTest_CordIo_Test *this_local;
  
  ~IoTest_CordIo_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(IoTest, CordIo) {
  CordOutputStream output;
  int size = WriteStuff(&output);
  absl::Cord cord = output.Consume();
  EXPECT_EQ(size, cord.size());

  {
    CordInputStream input(&cord);
    ReadStuff(&input);
  }
}